

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sobel.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> local_168;
  _InputArray local_148;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [40];
  Mat image;
  pointer local_c0;
  undefined1 local_60 [8];
  arguments_t args;
  char **argv_local;
  int argc_local;
  
  args.parameters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  arguments_t::arguments_t((arguments_t *)local_60,argc,argv);
  sVar1 = arguments_t::parametersSize((arguments_t *)local_60);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)args.parameters.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2," input output");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    arguments_t::operator[][abi_cxx11_((arguments_t *)local_f0,(int)local_60);
    cv::imread((string *)(local_f0 + 0x20),(int)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    if (local_c0 == (pointer)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot load ");
      arguments_t::operator[][abi_cxx11_((arguments_t *)local_110,(int)local_60);
      poVar2 = std::operator<<(poVar2,(string *)local_110);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_110);
    }
    else {
      gaussianFilter((Mat *)(local_f0 + 0x20),1,1.0);
      sobelFilter((Mat *)(local_f0 + 0x20));
      binaryFilter((Mat *)(local_f0 + 0x20),0.5);
      arguments_t::operator[][abi_cxx11_((arguments_t *)local_130,(int)local_60);
      cv::_InputArray::_InputArray(&local_148,(Mat *)(local_f0 + 0x20));
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_168);
      cv::imwrite((string *)local_130,&local_148,(vector *)&local_168);
      std::vector<int,_std::allocator<int>_>::~vector(&local_168);
      cv::_InputArray::~_InputArray(&local_148);
      std::__cxx11::string::~string((string *)local_130);
    }
    cv::Mat::~Mat((Mat *)(local_f0 + 0x20));
  }
  arguments_t::~arguments_t((arguments_t *)local_60);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    arguments_t args(argc, argv);

	if (args.parametersSize() < 2) {
		std::cout << "usage: " << argv[0] << " input output" << std::endl;
		return 0;
	}

    auto image = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
	if (!image.data) {
		std::cout << "Cannot load " << args[0] << std::endl;
		return 0;
	}

	gaussianFilter(image, 1, 1);
    sobelFilter(image);
    binaryFilter(image, 0.5);

    cv::imwrite(args[1], image);

    return 0;
}